

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O1

ARTKey duckdb::ARTKey::CreateARTKey<char_const*>(ArenaAllocator *allocator,char *value)

{
  uint uVar1;
  size_t sVar2;
  undefined8 in_RCX;
  ARTKey AVar3;
  string_t value_00;
  undefined4 uStack_1c;
  undefined8 uStack_18;
  
  sVar2 = strlen(value);
  uVar1 = (uint)sVar2;
  if (uVar1 < 0xd) {
    uStack_18._4_4_ = 0;
    uStack_1c = 0;
    uStack_18._0_4_ = 0;
    uStack_18 = (char *)0x0;
    if (uVar1 != 0) {
      switchD_012dd528::default(&uStack_1c,value,(ulong)(uVar1 & 0xf));
      uStack_18 = (char *)CONCAT44(uStack_18._4_4_,(undefined4)uStack_18);
    }
  }
  else {
    uStack_1c = *(undefined4 *)value;
    uStack_18 = value;
  }
  value_00.value.pointer.ptr = (char *)in_RCX;
  value_00.value._0_8_ = uStack_18;
  AVar3 = CreateARTKey<duckdb::string_t>
                    ((ARTKey *)allocator,(ArenaAllocator *)CONCAT44(uStack_1c,uVar1),value_00);
  return AVar3;
}

Assistant:

ARTKey ARTKey::CreateARTKey(ArenaAllocator &allocator, const char *value) {
	return ARTKey::CreateARTKey(allocator, string_t(value, UnsafeNumericCast<uint32_t>(strlen(value))));
}